

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_file.c
# Opt level: O2

int nni_plat_file_walk_inner(char *name,nni_plat_file_walker walkfn,void *arg,int flags,_Bool *stop)

{
  int iVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  int *piVar4;
  undefined1 local_f0 [8];
  stat sbuf;
  char *local_40;
  char *path;
  
  path._4_4_ = flags;
  __dirp = opendir(name);
  if (__dirp == (DIR *)0x0) {
    piVar4 = __errno_location();
    iVar1 = nni_plat_errno(*piVar4);
    return iVar1;
  }
  sbuf.__glibc_reserved[2] = (__syscall_slong_t)name;
  do {
    while( true ) {
      do {
        pdVar3 = readdir(__dirp);
        if (pdVar3 == (dirent *)0x0) {
          iVar1 = 0;
          goto LAB_0012e874;
        }
      } while ((pdVar3->d_name[0] == '.') &&
              ((pdVar3->d_name[1] == '\0' ||
               ((pdVar3->d_name[1] == '.' && (pdVar3->d_name[2] == '\0'))))));
      iVar1 = nni_asprintf(&local_40,"%s/%s",name,pdVar3->d_name);
      if (iVar1 != 0) goto LAB_0012e874;
      iVar1 = stat(local_40,(stat *)local_f0);
      if (iVar1 != 0) break;
      if ((((path._4_4_ & 4) == 0) || (iVar2 = 0, ((uint)sbuf.st_nlink & 0xf000) == 0x8000)) &&
         (iVar2 = (*walkfn)(local_40,arg), iVar2 == 1)) {
        *stop = true;
        iVar2 = 1;
      }
      if ((((path._4_4_ & 2) == 0) && (*stop == false)) &&
         ((((uint)sbuf.st_nlink & 0xf000) == 0x4000 &&
          (iVar1 = nni_plat_file_walk_inner(local_40,walkfn,arg,path._4_4_,stop), iVar1 != 0))))
      goto LAB_0012e868;
      nni_strfree(local_40);
      if ((iVar2 == 2) || (name = (char *)sbuf.__glibc_reserved[2], *stop != false)) {
        closedir(__dirp);
        return 0;
      }
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 2);
  iVar1 = nni_plat_errno(*piVar4);
LAB_0012e868:
  nni_strfree(local_40);
LAB_0012e874:
  closedir(__dirp);
  return iVar1;
}

Assistant:

static int
nni_plat_file_walk_inner(const char *name, nni_plat_file_walker walkfn,
    void *arg, int flags, bool *stop)
{
	DIR *dir;

	if ((dir = opendir(name)) == NULL) {
		return (nni_plat_errno(errno));
	}
	for (;;) {
		int            rv;
		struct dirent *ent;
		struct stat    sbuf;
		char *         path;
		int            walkrv;

		if ((ent = readdir(dir)) == NULL) {
			closedir(dir);
			return (0);
		}
		// Skip "." and ".."  -- we would like to skip all
		// directories, but that would require checking full
		// paths.
		if ((strcmp(ent->d_name, ".") == 0) ||
		    (strcmp(ent->d_name, "..") == 0)) {
			continue;
		}
		if ((rv = nni_asprintf(&path, "%s/%s", name, ent->d_name)) !=
		    0) {
			closedir(dir);
			return (rv);
		}
		if (stat(path, &sbuf) != 0) {
			if (errno == ENOENT) { // deleted while walking
				continue;
			}
			rv = nni_plat_errno(errno);
			nni_strfree(path);
			closedir(dir);
			return (rv);
		}
		if (flags & NNI_PLAT_FILE_WALK_FILES_ONLY) {
			if ((sbuf.st_mode & S_IFMT) == S_IFREG) {
				walkrv = walkfn(path, arg);
			} else {
				walkrv = NNI_PLAT_FILE_WALK_CONTINUE;
			}
		} else {
			walkrv = walkfn(path, arg);
		}

		if (walkrv == NNI_PLAT_FILE_WALK_STOP) {
			*stop = true;
		}

		if ((!*stop) && (rv != NNI_PLAT_FILE_WALK_PRUNE_CHILD) &&
		    ((flags & NNI_PLAT_FILE_WALK_SHALLOW) == 0) &&
		    ((sbuf.st_mode & S_IFMT) == S_IFDIR)) {
			rv = nni_plat_file_walk_inner(
			    path, walkfn, arg, flags, stop);
			if (rv != 0) {
				nni_strfree(path);
				closedir(dir);
				return (rv);
			}
		}

		nni_strfree(path);

		if ((walkrv == NNI_PLAT_FILE_WALK_PRUNE_SIB) || (*stop)) {
			break;
		}
	}
	closedir(dir);
	return (0);
}